

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O2

uint * Kit_TruthCompose(CloudManager *dd,uint *pTruth,int nVars,uint **pInputs,int nVarsAll,
                       Vec_Ptr_t *vStore,Vec_Int_t *vNodes)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  CloudNode *pFunc;
  uint *pOut;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  
  Cloud_Restart(dd);
  pFunc = Kit_TruthToCloud(dd,pTruth,nVars);
  iVar3 = Kit_CreateCloud(dd,pFunc,vNodes);
  if (iVar3 == 0) {
    puts("Kit_TruthCompose(): Internal failure!!!");
  }
  if (vStore->nSize < vNodes->nSize) {
    __assert_fail("Vec_IntSize(vNodes) <= Vec_PtrSize(vStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitCloud.c"
                  ,0x11a,
                  "unsigned int *Kit_TruthCompose(CloudManager *, unsigned int *, int, unsigned int **, int, Vec_Ptr_t *, Vec_Int_t *)"
                 );
  }
  pOut = (uint *)Vec_PtrEntry(vStore,0);
  Kit_TruthFill(pOut,nVarsAll);
  iVar3 = 1;
  uVar5 = (ulong)(uint)(1 << ((char)nVarsAll - 5U & 0x1f));
  uVar4 = nVarsAll;
  if (nVarsAll < 6) {
    uVar5 = 1;
  }
  for (; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
    uVar4 = Vec_IntEntry(vNodes,iVar3);
    pvVar6 = Vec_PtrEntry(vStore,uVar4 >> 0x11 & 0xfff);
    pvVar7 = Vec_PtrEntry(vStore,uVar4 >> 5 & 0xfff);
    pOut = (uint *)Vec_PtrEntry(vStore,iVar3);
    puVar2 = pInputs[(int)((~uVar4 | 0xffffffe0) + nVars)];
    uVar8 = uVar5;
    if ((uVar4 >> 0x1d & 1) == 0) {
      for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        uVar1 = *(uint *)((long)pvVar6 + uVar8 * 4 + -4);
        pOut[uVar8 - 1] =
             (*(uint *)((long)pvVar7 + uVar8 * 4 + -4) ^ uVar1) & puVar2[uVar8 - 1] ^ uVar1;
      }
    }
    else {
      for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        uVar1 = puVar2[uVar8 - 1];
        pOut[uVar8 - 1] =
             uVar1 & *(uint *)((long)pvVar7 + uVar8 * 4 + -4) |
             ~(*(uint *)((long)pvVar6 + uVar8 * 4 + -4) | uVar1);
      }
    }
  }
  if ((uVar4 >> 0x1e & 1) != 0) {
    Kit_TruthNot(pOut,pOut,nVarsAll);
  }
  return pOut;
}

Assistant:

unsigned * Kit_TruthCompose( CloudManager * dd, unsigned * pTruth, int nVars, 
    unsigned ** pInputs, int nVarsAll, Vec_Ptr_t * vStore, Vec_Int_t * vNodes )
{
    CloudNode * pFunc;
    unsigned * pThis, * pFan0, * pFan1;
    Kit_Mux_t Mux;
    int i, Entry, RetValue;
    // derive BDD from truth table
    Cloud_Restart( dd );
    pFunc = Kit_TruthToCloud( dd, pTruth, nVars );
    // convert it into nodes
    RetValue = Kit_CreateCloud( dd, pFunc, vNodes );
    if ( RetValue == 0 )
        printf( "Kit_TruthCompose(): Internal failure!!!\n" );
    // verify the result
//    pFan0 = Kit_CloudToTruth( vNodes, nVars, vStore, 0 );
//    if ( !Kit_TruthIsEqual( pTruth, pFan0, nVars ) )
//        printf( "Failed!\n" );
    // compute truth table from the BDD
    assert( Vec_IntSize(vNodes) <= Vec_PtrSize(vStore) );
    pThis = (unsigned *)Vec_PtrEntry( vStore, 0 );
    Kit_TruthFill( pThis, nVarsAll );
    Vec_IntForEachEntryStart( vNodes, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        pFan0 = (unsigned *)Vec_PtrEntry( vStore, Mux.e );
        pFan1 = (unsigned *)Vec_PtrEntry( vStore, Mux.t );
        pThis = (unsigned *)Vec_PtrEntry( vStore, i );
        Kit_TruthMuxPhase( pThis, pFan0, pFan1, pInputs[nVars-1-Mux.v], nVarsAll, Mux.c );
    }
    // complement the result
    if ( Mux.i )
        Kit_TruthNot( pThis, pThis, nVarsAll );
    return pThis;
}